

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
get_next_filled_position
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int pos,bool exclusive)

{
  uint uVar1;
  long lVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  int iVar4;
  
  uVar3 = (ulong)(uint)pos;
  if ((int)CONCAT71(in_register_00000011,exclusive) != 0) {
    uVar3 = (ulong)(pos + 1U);
    if (pos + 1U == this->data_capacity_) {
      return this->data_capacity_;
    }
  }
  iVar4 = (int)uVar3 >> 6;
  uVar3 = (this->bitmap_[iVar4] >> (uVar3 & 0x3f)) << (uVar3 & 0x3f);
  if (uVar3 == 0) {
    lVar2 = (long)iVar4 + 1;
    do {
      if (this->bitmap_size_ <= lVar2) {
        return this->data_capacity_;
      }
      uVar3 = this->bitmap_[lVar2];
      lVar2 = lVar2 + 1;
    } while (uVar3 == 0);
    iVar4 = (int)lVar2 + -1;
  }
  uVar1 = 0;
  for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
    uVar1 = uVar1 + 1;
  }
  return uVar1 | iVar4 << 6;
}

Assistant:

int get_next_filled_position(int pos, bool exclusive) const {
    if (exclusive) {
      pos++;
      if (pos == data_capacity_) {
        return data_capacity_;
      }
    }

    int curBitmapIdx = pos >> 6;
    uint64_t curBitmapData = bitmap_[curBitmapIdx];

    // Zero out extra bits
    int bit_pos = pos - (curBitmapIdx << 6);
    curBitmapData &= ~((1ULL << (bit_pos)) - 1);

    while (curBitmapData == 0) {
      curBitmapIdx++;
      if (curBitmapIdx >= bitmap_size_) {
        return data_capacity_;
      }
      curBitmapData = bitmap_[curBitmapIdx];
    }
    uint64_t bit = extract_rightmost_one(curBitmapData);
    return get_offset(curBitmapIdx, bit);
  }